

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O0

bool mg::fs::read_file(char *path,string *out)

{
  FILE *pFVar1;
  int *piVar2;
  char *pcVar3;
  ssize_t sVar4;
  ssize_t bytes_read;
  char buffer [4096];
  undefined1 local_38 [8];
  shared_ptr<void> _defer_close_fd;
  int fd;
  string *out_local;
  char *path_local;
  
  _defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       open(path,0);
  pFVar1 = _stderr;
  if (_defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
      == -1) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(pFVar1,"Failed to open \'%s\' - %s\n",path,pcVar3);
    path_local._7_1_ = false;
  }
  else {
    std::shared_ptr<void>::shared_ptr<mg::fs::read_file(char_const*,std::__cxx11::string&)::__0>
              ((shared_ptr<void> *)local_38,(nullptr_t)0x0,
               _defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._4_4_);
    std::__cxx11::string::clear();
    do {
      sVar4 = read(_defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._4_4_,&bytes_read,0x1000);
      pFVar1 = _stderr;
      if (sVar4 == -1) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        fprintf(pFVar1,"Failed to read \'%s\' - %s\n",path,pcVar3);
        path_local._7_1_ = false;
        goto LAB_00104276;
      }
      std::__cxx11::string::append((char *)out,(ulong)&bytes_read);
    } while (sVar4 == 0x1000);
    path_local._7_1_ = true;
LAB_00104276:
    std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_38);
  }
  return path_local._7_1_;
}

Assistant:

bool read_file(const char *path, std::string &out) {
  // Open file
  const int fd = open(path, O_RDONLY);
  if (fd == -1) {
    fprintf(stderr, "Failed to open '%s' - %s\n", path, strerror(errno));
    return false;
  }
  std::shared_ptr<void> _defer_close_fd(nullptr, [=](...) { close(fd); });

  static const size_t read_blocksz = 4096;
  char buffer[read_blocksz];
  out.clear();
  ssize_t bytes_read = 0;
  do {
    bytes_read = read(fd, buffer, read_blocksz);
    if (bytes_read == -1) {
      fprintf(stderr, "Failed to read '%s' - %s\n", path, strerror(errno));
      return false;
    }
    out.append(buffer, bytes_read);
  } while (bytes_read == read_blocksz);

  return true;
}